

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Rex2Gia(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_50;
  uint local_4c;
  int fVerbose;
  int fOrder;
  int c;
  int nArgcNew;
  char **pArgvNew;
  char *pStr;
  Gia_Man_t *pGia;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_4c = 1;
  local_50 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"avh");
      if (iVar1 == -1) {
        if (argc - globalUtilOptind == 1) {
          pNew = Gia_ManRex2Gia(argv[globalUtilOptind],local_4c,local_50);
          if (pNew != (Gia_Man_t *)0x0) {
            Abc_FrameUpdateGia(pAbc,pNew);
          }
          pAbc_local._4_4_ = 0;
        }
        else {
          Abc_Print(-1,"No regular expression is entered on the command line.\n");
          pAbc_local._4_4_ = 1;
        }
        return pAbc_local._4_4_;
      }
      if (iVar1 != 0x61) break;
      local_4c = local_4c ^ 1;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_50 = local_50 ^ 1;
  }
  Abc_Print(-2,"usage: &rex2gia [-avh] [string]\n");
  Abc_Print(-2,"\t         converts a regular expression into a sequential AIG\n");
  pcVar2 = "no";
  if (local_4c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-a     : toggle ordering input symbols alphabetically [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_50 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\tstring : representation of a regular expression\n");
  Abc_Print(-2,
            "\t         Special symbols: parentheses \'(\' and \')\', Kleene closure \'*\', union \'|\'\n"
           );
  Abc_Print(-2,"\t         All other characters are treated as symbols of the input alphabet.\n");
  Abc_Print(-2,"\t         For example, ((A*B|AC)D) is defined over the alphabet {A, B, C, D}\n");
  Abc_Print(-2,"\t         and generates the following language: {BD, ABD, AABD, AAABD, ..., ACD}\n"
           );
  Abc_Print(-2,
            "\t         A known limitation:  For the command to work correctly, each two-input union\n"
           );
  Abc_Print(-2,
            "\t         should have a dedicated pair of parentheses: ((A|B)|C) rather than (A|B|C)\n"
           );
  return 1;
}

Assistant:

int Abc_CommandAbc9Rex2Gia( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManRex2Gia( char * pStr, int fOrder, int fVerbose );
    Gia_Man_t * pGia = NULL;
    char * pStr = NULL;
    char ** pArgvNew;
    int nArgcNew;
    int c, fOrder = 1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "avh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fOrder ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "No regular expression is entered on the command line.\n" );
        return 1;
    }
    pStr = pArgvNew[0];
    pGia = Gia_ManRex2Gia( pStr, fOrder, fVerbose );
    if ( pGia )
        Abc_FrameUpdateGia( pAbc, pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &rex2gia [-avh] [string]\n" );
    Abc_Print( -2, "\t         converts a regular expression into a sequential AIG\n" );
    Abc_Print( -2, "\t-a     : toggle ordering input symbols alphabetically [default = %s]\n", fOrder? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tstring : representation of a regular expression\n");
    Abc_Print( -2, "\t         Special symbols: parentheses \'(\' and \')\', Kleene closure \'*\', union \'|'\n");
    Abc_Print( -2, "\t         All other characters are treated as symbols of the input alphabet.\n");
    Abc_Print( -2, "\t         For example, ((A*B|AC)D) is defined over the alphabet {A, B, C, D}\n");
    Abc_Print( -2, "\t         and generates the following language: {BD, ABD, AABD, AAABD, ..., ACD}\n");
    Abc_Print( -2, "\t         A known limitation:  For the command to work correctly, each two-input union\n");
    Abc_Print( -2, "\t         should have a dedicated pair of parentheses: ((A|B)|C) rather than (A|B|C)\n");
    return 1;
}